

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O0

void idct32_stage8_sse4_1
               (__m128i *bf1,__m128i *cospim32,__m128i *cospi32,__m128i *clamp_lo,__m128i *clamp_hi,
               __m128i *rounding,int bit)

{
  longlong in_RCX;
  __m128i *in_RDX;
  __m128i *in_RSI;
  long in_RDI;
  __m128i *in_R8;
  __m128i *out0;
  __m128i *in_R9;
  __m128i *out1;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  undefined8 extraout_XMM0_Qb_05;
  undefined8 extraout_XMM0_Qb_06;
  __m128i in0;
  __m128i in0_00;
  __m128i in0_01;
  __m128i in0_02;
  __m128i in0_03;
  __m128i in0_04;
  __m128i in0_05;
  __m128i in0_06;
  __m128i in1;
  __m128i in1_00;
  __m128i in1_01;
  __m128i in1_02;
  __m128i in1_03;
  __m128i in1_04;
  __m128i in1_05;
  __m128i in1_06;
  __m128i temp2;
  __m128i temp1;
  __m128i *in_stack_ffffffffffffffa8;
  undefined8 uVar1;
  __m128i *in_stack_ffffffffffffffb0;
  undefined8 uVar2;
  
  in0[1] = in_RDI + 0xf0;
  in0[0] = in_RDI;
  in1[1] = (longlong)in_R8;
  in1[0] = in_RCX;
  out0 = in_R8;
  out1 = in_R9;
  addsub_sse4_1(in0,in1,in_R8,in_R9,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_00[0] = in_RDI + 0x10;
  in0_00[1] = in_RDI + 0xe0;
  in1_00[1] = (longlong)in_R8;
  in1_00[0] = in_RCX;
  addsub_sse4_1(in0_00,in1_00,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_01[0] = in_RDI + 0x20;
  in0_01[1] = in_RDI + 0xd0;
  in1_01[1] = (longlong)in_R8;
  in1_01[0] = in_RCX;
  addsub_sse4_1(in0_01,in1_01,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_02[0] = in_RDI + 0x30;
  in0_02[1] = in_RDI + 0xc0;
  in1_02[1] = (longlong)in_R8;
  in1_02[0] = in_RCX;
  addsub_sse4_1(in0_02,in1_02,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_03[0] = in_RDI + 0x40;
  in0_03[1] = in_RDI + 0xb0;
  in1_03[1] = (longlong)in_R8;
  in1_03[0] = in_RCX;
  addsub_sse4_1(in0_03,in1_03,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_04[0] = in_RDI + 0x50;
  in0_04[1] = in_RDI + 0xa0;
  in1_04[1] = (longlong)in_R8;
  in1_04[0] = in_RCX;
  addsub_sse4_1(in0_04,in1_04,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_05[0] = in_RDI + 0x60;
  in0_05[1] = in_RDI + 0x90;
  in1_05[1] = (longlong)in_R8;
  in1_05[0] = in_RCX;
  addsub_sse4_1(in0_05,in1_05,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  in0_06[0] = in_RDI + 0x70;
  in0_06[1] = in_RDI + 0x80;
  in1_06[1] = (longlong)in_R8;
  in1_06[0] = in_RCX;
  addsub_sse4_1(in0_06,in1_06,out0,out1,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0);
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x140),in_RDX,(__m128i *)(in_RDI + 0x1b0),in_R9,
                  (int)temp2[1]);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x140),in_RDX,(__m128i *)(in_RDI + 0x1b0),in_R9,
                  (int)temp2[1]);
  *(undefined8 *)(in_RDI + 0x1b0) = extraout_XMM0_Qa_00;
  *(undefined8 *)(in_RDI + 0x1b8) = extraout_XMM0_Qb_00;
  *(undefined8 *)(in_RDI + 0x140) = extraout_XMM0_Qa;
  *(undefined8 *)(in_RDI + 0x148) = extraout_XMM0_Qb;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x150),in_RDX,(__m128i *)(in_RDI + 0x1a0),in_R9,
                  (int)temp2[1]);
  uVar1 = extraout_XMM0_Qa_01;
  uVar2 = extraout_XMM0_Qb_01;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x150),in_RDX,(__m128i *)(in_RDI + 0x1a0),in_R9,
                  (int)temp2[1]);
  *(undefined8 *)(in_RDI + 0x1a0) = extraout_XMM0_Qa_02;
  *(undefined8 *)(in_RDI + 0x1a8) = extraout_XMM0_Qb_02;
  *(undefined8 *)(in_RDI + 0x150) = uVar1;
  *(undefined8 *)(in_RDI + 0x158) = uVar2;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x160),in_RDX,(__m128i *)(in_RDI + 400),in_R9,
                  (int)temp2[1]);
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x160),in_RDX,(__m128i *)(in_RDI + 400),in_R9,
                  (int)temp2[1]);
  *(undefined8 *)(in_RDI + 400) = extraout_XMM0_Qa_04;
  *(undefined8 *)(in_RDI + 0x198) = extraout_XMM0_Qb_04;
  *(undefined8 *)(in_RDI + 0x160) = extraout_XMM0_Qa_03;
  *(undefined8 *)(in_RDI + 0x168) = extraout_XMM0_Qb_03;
  half_btf_sse4_1(in_RSI,(__m128i *)(in_RDI + 0x170),in_RDX,(__m128i *)(in_RDI + 0x180),in_R9,
                  (int)temp2[1]);
  uVar1 = extraout_XMM0_Qa_05;
  uVar2 = extraout_XMM0_Qb_05;
  half_btf_sse4_1(in_RDX,(__m128i *)(in_RDI + 0x170),in_RDX,(__m128i *)(in_RDI + 0x180),in_R9,
                  (int)temp2[1]);
  *(undefined8 *)(in_RDI + 0x180) = extraout_XMM0_Qa_06;
  *(undefined8 *)(in_RDI + 0x188) = extraout_XMM0_Qb_06;
  *(undefined8 *)(in_RDI + 0x170) = uVar1;
  *(undefined8 *)(in_RDI + 0x178) = uVar2;
  return;
}

Assistant:

static inline void idct32_stage8_sse4_1(__m128i *bf1, const __m128i *cospim32,
                                        const __m128i *cospi32,
                                        const __m128i *clamp_lo,
                                        const __m128i *clamp_hi,
                                        const __m128i *rounding, int bit) {
  __m128i temp1, temp2;
  addsub_sse4_1(bf1[0], bf1[15], bf1 + 0, bf1 + 15, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[1], bf1[14], bf1 + 1, bf1 + 14, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[2], bf1[13], bf1 + 2, bf1 + 13, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[3], bf1[12], bf1 + 3, bf1 + 12, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[4], bf1[11], bf1 + 4, bf1 + 11, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[5], bf1[10], bf1 + 5, bf1 + 10, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[6], bf1[9], bf1 + 6, bf1 + 9, clamp_lo, clamp_hi);
  addsub_sse4_1(bf1[7], bf1[8], bf1 + 7, bf1 + 8, clamp_lo, clamp_hi);

  temp1 = half_btf_sse4_1(cospim32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[27] =
      half_btf_sse4_1(cospi32, &bf1[20], cospi32, &bf1[27], rounding, bit);
  bf1[20] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[26] =
      half_btf_sse4_1(cospi32, &bf1[21], cospi32, &bf1[26], rounding, bit);
  bf1[21] = temp2;
  temp1 = half_btf_sse4_1(cospim32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[25] =
      half_btf_sse4_1(cospi32, &bf1[22], cospi32, &bf1[25], rounding, bit);
  bf1[22] = temp1;
  temp2 = half_btf_sse4_1(cospim32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[24] =
      half_btf_sse4_1(cospi32, &bf1[23], cospi32, &bf1[24], rounding, bit);
  bf1[23] = temp2;
}